

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser * init_parse_flavor(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"kind sym tval char glyph",parse_flavor_kind);
  parser_reg(p,"flavor uint index sym attr ?str desc",parse_flavor_flavor);
  parser_reg(p,"fixed uint index sym sval sym attr ?str desc",parse_flavor_flavor);
  return p;
}

Assistant:

static struct parser *init_parse_flavor(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);

	parser_reg(p, "kind sym tval char glyph", parse_flavor_kind);
	parser_reg(p, "flavor uint index sym attr ?str desc", parse_flavor_flavor);
	parser_reg(p, "fixed uint index sym sval sym attr ?str desc", parse_flavor_flavor);

	return p;
}